

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  reference ppVar1;
  bool bVar2;
  bool local_e1;
  Value *value;
  _Base_ptr local_a8;
  undefined1 local_a0 [8];
  value_type defaultValue;
  _Self local_70;
  _Self local_68;
  iterator it;
  CZString actualKey;
  Value local_40;
  byte local_21;
  char *pcStack_20;
  bool isStatic_local;
  char *key_local;
  Value *this_local;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 7;
  }
  local_21 = isStatic;
  pcStack_20 = key;
  key_local = (char *)this;
  if (bVar2) {
    if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
      Value(&local_40,objectValue);
      operator=(this,&local_40);
      ~Value(&local_40);
    }
    CZString::CZString((CZString *)&it,pcStack_20,((byte)~local_21 & 1) * 2);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::lower_bound((this->value_).map_,(CZString *)&it);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar2 = std::operator!=(&local_68,&local_70);
    local_e1 = false;
    if (bVar2) {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_68);
      local_e1 = CZString::operator==(&ppVar1->first,(CZString *)&it);
    }
    if (local_e1 == false) {
      std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_a0,(CZString *)&it,
                 (Value *)null);
      this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 *)(this->value_).map_;
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
      _Rb_tree_const_iterator
                ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                 &value,&local_68);
      local_a8 = (_Base_ptr)
                 std::
                 map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                           (this_00,(const_iterator)value,
                            (pair<const_Json::Value::CZString,_Json::Value> *)local_a0);
      local_68._M_node = local_a8;
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_68);
      this_local = &ppVar1->second;
      defaultValue.second.comments_._4_4_ = 1;
      std::pair<const_Json::Value::CZString,_Json::Value>::~pair
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_a0);
    }
    else {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_68);
      this_local = &ppVar1->second;
      defaultValue.second.comments_._4_4_ = 1;
    }
    CZString::~CZString((CZString *)&it);
    return this_local;
  }
  __assert_fail("type_ == nullValue || type_ == objectValue",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                ,0x475,"Value &Json::Value::resolveReference(const char *, bool)");
}

Assistant:

Value &
Value::resolveReference( const char *key, 
                         bool isStatic )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == objectValue );
   if ( type_ == nullValue )
      *this = Value( objectValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString actualKey( key, isStatic ? CZString::noDuplication 
                                     : CZString::duplicateOnCopy );
   ObjectValues::iterator it = value_.map_->lower_bound( actualKey );
   if ( it != value_.map_->end()  &&  (*it).first == actualKey )
      return (*it).second;

   ObjectValues::value_type defaultValue( actualKey, null );
   it = value_.map_->insert( it, defaultValue );
   Value &value = (*it).second;
   return value;
#else
   return value_.map_->resolveReference( key, isStatic );
#endif
}